

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

int AllocateTransformBuffer(VP8LEncoder *enc,int width,int height)

{
  int iVar1;
  uint32_t *puVar2;
  long lVar3;
  long lVar4;
  ulong nmemb;
  
  if (enc->use_predict == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = ((long)(width * 2) + 3U >> 2) + (long)(width * 2 + 2);
  }
  if ((enc->use_predict == 0) && (enc->use_cross_color == 0)) {
    lVar3 = 0;
  }
  else {
    lVar3 = (ulong)(height + 3U >> 2) * (ulong)(width + 3U >> 2);
  }
  nmemb = lVar3 + (long)height * (long)width + lVar4 + 0x10;
  puVar2 = enc->transform_mem;
  if ((puVar2 == (uint32_t *)0x0) || (enc->transform_mem_size < nmemb)) {
    WebPSafeFree(puVar2);
    enc->transform_mem = (uint32_t *)0x0;
    enc->transform_mem_size = 0;
    puVar2 = (uint32_t *)WebPSafeMalloc(nmemb,4);
    if (puVar2 == (uint32_t *)0x0) {
      iVar1 = WebPEncodingSetError(enc->pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar1;
    }
    enc->transform_mem = puVar2;
    enc->transform_mem_size = nmemb;
    enc->argb_content = kEncoderNone;
  }
  enc->argb = puVar2;
  puVar2 = (uint32_t *)((long)puVar2 + (long)height * (long)width * 4 + 0x1f & 0xffffffffffffffe0);
  enc->argb_scratch = puVar2;
  enc->transform_data = (uint32_t *)((long)puVar2 + lVar4 * 4 + 0x1f & 0xffffffffffffffe0);
  enc->current_width = width;
  return 1;
}

Assistant:

static int AllocateTransformBuffer(VP8LEncoder* const enc, int width,
                                   int height) {
  const uint64_t image_size = (uint64_t)width * height;
  // VP8LResidualImage needs room for 2 scanlines of uint32 pixels with an extra
  // pixel in each, plus 2 regular scanlines of bytes.
  // TODO(skal): Clean up by using arithmetic in bytes instead of words.
  const uint64_t argb_scratch_size =
      enc->use_predict ? (width + 1) * 2 + (width * 2 + sizeof(uint32_t) - 1) /
                                               sizeof(uint32_t)
                        : 0;
  const uint64_t transform_data_size =
      (enc->use_predict || enc->use_cross_color)
          ? (uint64_t)VP8LSubSampleSize(width, MIN_TRANSFORM_BITS) *
                VP8LSubSampleSize(height, MIN_TRANSFORM_BITS)
          : 0;
  const uint64_t max_alignment_in_words =
      (WEBP_ALIGN_CST + sizeof(uint32_t) - 1) / sizeof(uint32_t);
  const uint64_t mem_size = image_size + max_alignment_in_words +
                            argb_scratch_size + max_alignment_in_words +
                            transform_data_size;
  uint32_t* mem = enc->transform_mem;
  if (mem == NULL || mem_size > enc->transform_mem_size) {
    ClearTransformBuffer(enc);
    mem = (uint32_t*)WebPSafeMalloc(mem_size, sizeof(*mem));
    if (mem == NULL) {
      return WebPEncodingSetError(enc->pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    enc->transform_mem = mem;
    enc->transform_mem_size = (size_t)mem_size;
    enc->argb_content = kEncoderNone;
  }
  enc->argb = mem;
  mem = (uint32_t*)WEBP_ALIGN(mem + image_size);
  enc->argb_scratch = mem;
  mem = (uint32_t*)WEBP_ALIGN(mem + argb_scratch_size);
  enc->transform_data = mem;

  enc->current_width = width;
  return 1;
}